

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_tessellation.cpp
# Opt level: O1

bool dxil_spv::emit_load_patch_constant_instruction(Impl *impl,CallInst *instruction)

{
  ExecutionModel EVar1;
  uint value;
  Operation *op;
  bool bVar2;
  Id typeId;
  uint uVar3;
  Id IVar4;
  Id IVar5;
  Id type_id;
  Builder *this;
  Value *pVVar6;
  Operation *pOVar7;
  Op OVar8;
  mapped_type *pmVar9;
  uint32_t output_element_index;
  uint32_t local_4c;
  CallInst *local_48;
  mapped_type *local_40;
  Operation *local_38;
  
  this = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand(&instruction->super_Instruction,1,&local_4c);
  if (bVar2) {
    local_40 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->patch_elements_meta,&local_4c);
    IVar5 = (local_40->super_ElementMeta).id;
    typeId = spv::Builder::getDerefTypeId(this,IVar5);
    OVar8 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start[typeId]->opCode & ~OpUndef;
    if (OVar8 == OpTypeArray) {
      typeId = spv::Builder::getContainedTypeId(this,typeId);
    }
    uVar3 = spv::Builder::getNumTypeConstituents(this,typeId);
    if ((OVar8 == OpTypeArray) || (pmVar9 = local_40, 1 < uVar3)) {
      EVar1 = impl->execution_model;
      local_48 = instruction;
      typeId = spv::Builder::getScalarTypeId(this,typeId);
      instruction = local_48;
      IVar4 = spv::Builder::makePointer
                        (this,(uint)(EVar1 != ExecutionModelTessellationEvaluation) * 2 +
                              StorageClassInput,typeId);
      pOVar7 = Converter::Impl::allocate(impl,OpAccessChain,IVar4);
      IVar4 = pOVar7->id;
      Operation::add_id(pOVar7,IVar5);
      pmVar9 = local_40;
      if (OVar8 == OpTypeArray) {
        pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
        IVar5 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
        if ((pmVar9->super_ElementMeta).semantic_offset != 0) {
          type_id = spv::Builder::makeIntegerType(this,0x20,false);
          local_38 = Converter::Impl::allocate(impl,OpIAdd,type_id);
          Operation::add_id(local_38,IVar5);
          value = (pmVar9->super_ElementMeta).semantic_offset;
          IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
          instruction = local_48;
          IVar5 = spv::Builder::makeIntConstant(this,IVar5,value,false);
          op = local_38;
          Operation::add_id(local_38,IVar5);
          Converter::Impl::add(impl,op,false);
          IVar5 = op->id;
        }
        Operation::add_id(pOVar7,IVar5);
      }
      if (1 < uVar3) {
        pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
        IVar5 = Converter::Impl::get_id_for_value(impl,pVVar6,0x20);
        Operation::add_id(pOVar7,IVar5);
      }
      Converter::Impl::add(impl,pOVar7,false);
      IVar5 = IVar4;
    }
    pOVar7 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction,typeId);
    Operation::add_id(pOVar7,IVar5);
    Converter::Impl::add(impl,pOVar7,false);
    Converter::Impl::fixup_load_type_io
              (impl,(pmVar9->super_ElementMeta).component_type,1,(Value *)instruction);
  }
  return bVar2;
}

Assistant:

bool emit_load_patch_constant_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t output_element_index;
	if (!get_constant_operand(instruction, 1, &output_element_index))
		return false;

	const auto &meta = impl.patch_elements_meta[output_element_index];
	uint32_t var_id = meta.id;
	spv::Id ptr_id;

	spv::Id output_type_id = builder.getDerefTypeId(var_id);

	bool row_index = false;
	if (builder.isArrayType(output_type_id))
	{
		row_index = true;
		output_type_id = builder.getContainedTypeId(output_type_id);
	}
	uint32_t num_cols = builder.getNumTypeComponents(output_type_id);

	spv::StorageClass storage = impl.execution_model == spv::ExecutionModelTessellationEvaluation ?
	                                spv::StorageClassInput :
	                                spv::StorageClassOutput;

	spv::Id load_type_id;

	if (row_index || num_cols > 1)
	{
		load_type_id = builder.getScalarTypeId(output_type_id);
		Operation *op =
		    impl.allocate(spv::OpAccessChain, builder.makePointer(storage, load_type_id));
		ptr_id = op->id;
		op->add_id(var_id);

		if (row_index)
		{
			spv::Id row_id = impl.get_id_for_value(instruction->getOperand(2));

			if (meta.semantic_offset != 0)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(row_id);
				add_op->add_id(builder.makeUintConstant(meta.semantic_offset));
				impl.add(add_op);

				row_id = add_op->id;
			}

			op->add_id(row_id);
		}

		if (num_cols > 1)
			op->add_id(impl.get_id_for_value(instruction->getOperand(3), 32));

		impl.add(op);
	}
	else
	{
		ptr_id = var_id;
		load_type_id = output_type_id;
	}

	Operation *op = impl.allocate(spv::OpLoad, instruction, load_type_id);
	op->add_id(ptr_id);
	impl.add(op);

	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	return true;
}